

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

int rb_read_uniform(aom_read_bit_buffer *rb,int n)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  uVar1 = 0x1f;
  if (n != 0) {
    for (; (uint)n >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  iVar3 = (uVar1 ^ 0xffffffe0) + 0x21;
  if (n == 0) {
    iVar3 = 0;
  }
  iVar4 = (1 << ((byte)iVar3 & 0x1f)) - n;
  iVar3 = aom_rb_read_literal(rb,iVar3 + -1);
  if (iVar4 <= iVar3) {
    iVar2 = aom_rb_read_bit(rb);
    iVar3 = (iVar3 * 2 - iVar4) + iVar2;
  }
  return iVar3;
}

Assistant:

static int rb_read_uniform(struct aom_read_bit_buffer *const rb, int n) {
  const int l = get_unsigned_bits(n);
  const int m = (1 << l) - n;
  const int v = aom_rb_read_literal(rb, l - 1);
  assert(l != 0);
  if (v < m)
    return v;
  else
    return (v << 1) - m + aom_rb_read_bit(rb);
}